

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.h
# Opt level: O1

void __thiscall Memory::MarkContext::Cleanup(MarkContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty(&this->markStack);
  if (bVar2) {
    bVar2 = PageStack<FinalizableObject_*>::IsEmpty(&this->trackStack);
    if (!bVar2) goto LAB_0072514c;
  }
  else {
LAB_0072514c:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                       ,0x67,"(!HasPendingObjects())","!HasPendingObjects()");
    if (!bVar2) goto LAB_00725208;
    *puVar3 = 0;
  }
  if ((this->pagePool->pageAllocator).disableAllocationOutOfMemory == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                       ,0x68,"(!GetPageAllocator()->DisableAllocationOutOfMemory())",
                       "!GetPageAllocator()->DisableAllocationOutOfMemory()");
    if (!bVar2) {
LAB_00725208:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  PagePool::ReleaseFreePages(this->pagePool);
  return;
}

Assistant:

void Cleanup()
    {
        Assert(!HasPendingObjects());
        Assert(!GetPageAllocator()->DisableAllocationOutOfMemory());
        this->pagePool->ReleaseFreePages();
    }